

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O3

int aom_compute_pyramid(YV12_BUFFER_CONFIG *frame,int bit_depth,int n_levels,ImagePyramid *pyr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int out_stride;
  PyramidLayer *pPVar4;
  uint8_t *puVar5;
  int width;
  int height;
  _Bool _Var6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  
  pthread_mutex_lock((pthread_mutex_t *)pyr);
  iVar7 = pyr->filled_levels;
  if (pyr->max_levels < n_levels) {
    n_levels = pyr->max_levels;
  }
  iVar10 = n_levels;
  if (iVar7 < n_levels) {
    if (iVar7 == 0) {
      uVar1 = (frame->field_2).field_0.y_crop_width;
      uVar2 = (frame->field_3).field_0.y_crop_height;
      uVar12 = (ulong)uVar2;
      iVar7 = (frame->field_4).field_0.y_stride;
      pPVar4 = pyr->layers;
      puVar9 = (frame->field_5).field_0.y_buffer;
      if ((frame->flags & 8) == 0) {
        pPVar4->buffer = puVar9;
        pPVar4->width = uVar1;
        pPVar4->height = uVar2;
        pPVar4->stride = iVar7;
        iVar7 = 1;
      }
      else {
        lVar16 = (long)(int)uVar1;
        puVar5 = pPVar4->buffer;
        iVar3 = pPVar4->stride;
        lVar11 = (long)iVar3;
        if (0 < (int)uVar2) {
          lVar17 = (long)puVar9 * 2;
          uVar14 = 0;
          puVar9 = puVar5;
          do {
            if (0 < (int)uVar1) {
              uVar15 = 0;
              do {
                puVar9[uVar15] =
                     (uint8_t)(*(ushort *)(lVar17 + uVar15 * 2) >> ((char)bit_depth - 8U & 0x1f));
                uVar15 = uVar15 + 1;
              } while (uVar1 != uVar15);
            }
            uVar14 = uVar14 + 1;
            puVar9 = puVar9 + lVar11;
            lVar17 = lVar17 + (long)iVar7 * 2;
            puVar8 = puVar5;
          } while (uVar14 != uVar12);
          do {
            auVar20 = ZEXT216(CONCAT11(*puVar8,*puVar8));
            auVar20 = pshuflw(auVar20,auVar20,0);
            uVar19 = auVar20._0_4_;
            *(undefined4 *)(puVar8 + -0x10) = uVar19;
            *(undefined4 *)(puVar8 + -0xc) = uVar19;
            *(undefined4 *)(puVar8 + -8) = uVar19;
            *(undefined4 *)(puVar8 + -4) = uVar19;
            auVar20 = ZEXT216(CONCAT11(puVar8[lVar16 + -1],puVar8[lVar16 + -1]));
            auVar20 = pshuflw(auVar20,auVar20,0);
            uVar19 = auVar20._0_4_;
            puVar9 = puVar8 + lVar16;
            *(undefined4 *)puVar9 = uVar19;
            *(undefined4 *)(puVar9 + 4) = uVar19;
            *(undefined4 *)(puVar9 + 8) = uVar19;
            *(undefined4 *)(puVar9 + 0xc) = uVar19;
            uVar12 = uVar12 - 1;
            puVar8 = puVar8 + lVar11;
          } while (uVar12 != 0);
        }
        lVar17 = (long)(int)uVar2;
        puVar9 = puVar5 + lVar11 * -0x10 + -0x10;
        lVar18 = 0x10;
        do {
          memcpy(puVar9,puVar5 + -0x10,lVar16 + 0x20U);
          puVar9 = puVar9 + lVar11;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        lVar18 = lVar17 + -1;
        puVar9 = puVar5 + lVar11 * lVar17 + -0x10;
        do {
          memcpy(puVar9,puVar5 + (long)(int)((uVar2 - 1) * iVar3) + -0x10,lVar16 + 0x20U);
          lVar18 = lVar18 + 1;
          puVar9 = puVar9 + lVar11;
        } while (lVar18 < lVar17 + 0xf);
        iVar7 = 1;
      }
    }
    if (iVar7 < n_levels) {
      lVar11 = (long)iVar7;
      do {
        pPVar4 = pyr->layers;
        puVar9 = pPVar4[lVar11 + -1].buffer;
        iVar7 = pPVar4[lVar11 + -1].stride;
        puVar5 = pPVar4[lVar11].buffer;
        iVar3 = pPVar4[lVar11].width;
        lVar18 = (long)iVar3;
        uVar1 = pPVar4[lVar11].height;
        uVar12 = (ulong)uVar1;
        lVar16 = (long)(int)uVar1;
        out_stride = pPVar4[lVar11].stride;
        lVar17 = (long)out_stride;
        width = iVar3 * 2;
        height = uVar1 * 2;
        _Var6 = should_resize_by_half(height,width,uVar1,iVar3);
        if (_Var6) {
          _Var6 = av1_resize_plane_to_half(puVar9,height,width,iVar7,puVar5,uVar1,iVar3,out_stride);
        }
        else {
          _Var6 = av1_resize_plane(puVar9,height,width,iVar7,puVar5,uVar1,iVar3,out_stride);
        }
        if (_Var6 == false) {
          iVar10 = -1;
          break;
        }
        puVar9 = puVar5;
        if (0 < (int)uVar1) {
          do {
            auVar20 = ZEXT216(CONCAT11(*puVar9,*puVar9));
            auVar20 = pshuflw(auVar20,auVar20,0);
            uVar19 = auVar20._0_4_;
            *(undefined4 *)(puVar9 + -0x10) = uVar19;
            *(undefined4 *)(puVar9 + -0xc) = uVar19;
            *(undefined4 *)(puVar9 + -8) = uVar19;
            *(undefined4 *)(puVar9 + -4) = uVar19;
            auVar20 = ZEXT216(CONCAT11(puVar9[lVar18 + -1],puVar9[lVar18 + -1]));
            auVar20 = pshuflw(auVar20,auVar20,0);
            uVar19 = auVar20._0_4_;
            puVar8 = puVar9 + lVar18;
            *(undefined4 *)puVar8 = uVar19;
            *(undefined4 *)(puVar8 + 4) = uVar19;
            *(undefined4 *)(puVar8 + 8) = uVar19;
            *(undefined4 *)(puVar8 + 0xc) = uVar19;
            puVar9 = puVar9 + lVar17;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        puVar9 = puVar5 + -0x10 + lVar17 * -0x10;
        lVar13 = 0x10;
        do {
          memcpy(puVar9,puVar5 + -0x10,lVar18 + 0x20U);
          puVar9 = puVar9 + lVar17;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
        lVar13 = lVar16 + -1;
        puVar9 = puVar5 + lVar17 * lVar16 + -0x10;
        do {
          memcpy(puVar9,puVar5 + (long)(int)((uVar1 - 1) * out_stride) + -0x10,lVar18 + 0x20U);
          lVar13 = lVar13 + 1;
          puVar9 = puVar9 + lVar17;
        } while (lVar13 < lVar16 + 0xf);
        lVar11 = lVar11 + 1;
      } while (lVar11 != n_levels);
    }
    pyr->filled_levels = n_levels;
  }
  pthread_mutex_unlock((pthread_mutex_t *)pyr);
  return iVar10;
}

Assistant:

int aom_compute_pyramid(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                        int n_levels, ImagePyramid *pyr) {
  assert(pyr);

  // Per the comments in the ImagePyramid struct, we must take this mutex
  // before reading or writing the filled_levels field, and hold it while
  // computing any additional pyramid levels, to ensure proper behaviour
  // when multithreading is used
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD

  n_levels = AOMMIN(n_levels, pyr->max_levels);
  int result = n_levels;
  if (pyr->filled_levels < n_levels) {
    // Compute any missing levels that we need
    result = fill_pyramid(frame, bit_depth, n_levels, pyr);
  }

  // At this point, as long as result >= 0, the requested number of pyramid
  // levels are guaranteed to be valid, and can be safely read from without
  // holding the mutex any further
  assert(IMPLIES(result >= 0, pyr->filled_levels >= n_levels));
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
  return result;
}